

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismSearcher::degree_sort
          (HomomorphismSearcher *this,vector<int,_std::allocator<int>_> *branch_v,uint branch_v_end,
          bool reverse)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __seed;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_innards_homomorphism_searcher_cc:286:68)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_innards_homomorphism_searcher_cc:286:68)>
  __comp_00;
  bool local_39;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  local_38;
  
  if (branch_v_end != 0) {
    __seed._M_current =
         (branch_v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
    local_39 = reverse;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
    ::_Temporary_buffer(&local_38,__seed,(ulong)branch_v_end + 1 >> 1);
    if (local_38._M_buffer == (int *)0x0) {
      __comp_00._M_comp.this = this;
      __comp_00._M_comp.reverse = &local_39;
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismSearcher::degree_sort(std::vector<int,std::allocator<int>>&,unsigned_int,bool)::__0>>
                (__seed,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (__seed._M_current + branch_v_end),__comp_00);
    }
    else {
      __comp._M_comp.this = this;
      __comp._M_comp.reverse = &local_39;
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismSearcher::degree_sort(std::vector<int,std::allocator<int>>&,unsigned_int,bool)::__0>>
                (__seed,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (__seed._M_current + branch_v_end),local_38._M_buffer,local_38._M_len,__comp
                );
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
    ::~_Temporary_buffer(&local_38);
  }
  return;
}

Assistant:

auto HomomorphismSearcher::degree_sort(
    vector<int> & branch_v,
    unsigned branch_v_end,
    bool reverse) -> void
{
    stable_sort(branch_v.begin(), branch_v.begin() + branch_v_end, [&](int a, int b) -> bool {
        return reverse
            ? model.target_degree(0, a) < model.target_degree(0, b)
            : -model.target_degree(0, a) < -model.target_degree(0, b);
    });
}